

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::StairsRenderer<ImPlot::GetterXsYs<long_long>,_ImPlot::TransformerLogLog>::operator()
          (StairsRenderer<ImPlot::GetterXsYs<long_long>,_ImPlot::TransformerLogLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ImVec2 IVar7;
  int iVar8;
  ImU32 IVar9;
  GetterXsYs<long_long> *pGVar10;
  TransformerLogLog *pTVar11;
  long lVar12;
  ImPlotPlot *pIVar13;
  ImDrawVert *pIVar14;
  uint *puVar15;
  ImPlotContext *pIVar16;
  bool bVar17;
  long lVar18;
  double dVar19;
  double dVar20;
  ImVec2 IVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  
  pIVar16 = GImPlot;
  pGVar10 = this->Getter;
  pTVar11 = this->Transformer;
  iVar8 = pGVar10->Count;
  lVar18 = (long)(((pGVar10->Offset + prim + 1) % iVar8 + iVar8) % iVar8) * (long)pGVar10->Stride;
  lVar12 = *(long *)((long)pGVar10->Ys + lVar18);
  dVar19 = log10((double)*(long *)((long)pGVar10->Xs + lVar18) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar3 = pIVar16->LogDenX;
  pIVar13 = pIVar16->CurrentPlot;
  dVar4 = (pIVar13->XAxis).Range.Min;
  dVar5 = (pIVar13->XAxis).Range.Max;
  dVar20 = log10((double)lVar12 / pIVar13->YAxis[pTVar11->YAxis].Range.Min);
  iVar8 = pTVar11->YAxis;
  pIVar13 = pIVar16->CurrentPlot;
  dVar6 = pIVar13->YAxis[iVar8].Range.Min;
  IVar21.x = (float)((((double)(float)(dVar19 / dVar3) * (dVar5 - dVar4) + dVar4) -
                     (pIVar13->XAxis).Range.Min) * pIVar16->Mx +
                    (double)pIVar16->PixelRange[iVar8].Min.x);
  fVar22 = (float)((((double)(float)(dVar20 / pIVar16->LogDenY[iVar8]) *
                     (pIVar13->YAxis[iVar8].Range.Max - dVar6) + dVar6) - dVar6) *
                   pIVar16->My[iVar8] + (double)pIVar16->PixelRange[iVar8].Min.y);
  fVar2 = (this->P1).x;
  fVar23 = (this->P1).y;
  fVar24 = fVar23;
  if (fVar22 <= fVar23) {
    fVar24 = fVar22;
  }
  bVar17 = false;
  if ((fVar24 < (cull_rect->Max).y) &&
     (fVar23 = (float)(-(uint)(fVar22 <= fVar23) & (uint)fVar23 |
                      ~-(uint)(fVar22 <= fVar23) & (uint)fVar22), pfVar1 = &(cull_rect->Min).y,
     bVar17 = false, *pfVar1 <= fVar23 && fVar23 != *pfVar1)) {
    fVar23 = fVar2;
    if (IVar21.x <= fVar2) {
      fVar23 = IVar21.x;
    }
    if (fVar23 < (cull_rect->Max).x) {
      fVar23 = (float)(~-(uint)(IVar21.x <= fVar2) & (uint)IVar21.x |
                      -(uint)(IVar21.x <= fVar2) & (uint)fVar2);
      bVar17 = (cull_rect->Min).x <= fVar23 && fVar23 != (cull_rect->Min).x;
    }
  }
  if (bVar17 != false) {
    fVar23 = (this->P1).y;
    fVar24 = fVar23 + this->HalfWeight;
    fVar23 = fVar23 - this->HalfWeight;
    IVar9 = this->Col;
    IVar7 = *uv;
    pIVar14 = DrawList->_VtxWritePtr;
    (pIVar14->pos).x = fVar2;
    (pIVar14->pos).y = fVar24;
    DrawList->_VtxWritePtr->uv = IVar7;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14->col = IVar9;
    pIVar14[1].pos.x = IVar21.x;
    pIVar14[1].pos.y = fVar23;
    DrawList->_VtxWritePtr[1].uv = IVar7;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[1].col = IVar9;
    pIVar14[2].pos.x = fVar2;
    pIVar14[2].pos.y = fVar23;
    pIVar14[2].uv = IVar7;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[2].col = IVar9;
    pIVar14[3].pos.x = IVar21.x;
    pIVar14[3].pos.y = fVar24;
    pIVar14[3].uv = IVar7;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[3].col = IVar9;
    DrawList->_VtxWritePtr = pIVar14 + 4;
    puVar15 = DrawList->_IdxWritePtr;
    *puVar15 = DrawList->_VtxCurrentIdx;
    puVar15[1] = DrawList->_VtxCurrentIdx + 1;
    puVar15[2] = DrawList->_VtxCurrentIdx + 2;
    puVar15[3] = DrawList->_VtxCurrentIdx;
    puVar15[4] = DrawList->_VtxCurrentIdx + 1;
    puVar15[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar15 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
    fVar24 = IVar21.x - this->HalfWeight;
    fVar23 = this->HalfWeight + IVar21.x;
    fVar2 = (this->P1).y;
    IVar9 = this->Col;
    IVar7 = *uv;
    pIVar14[4].pos.x = fVar24;
    pIVar14[4].pos.y = fVar22;
    DrawList->_VtxWritePtr->uv = IVar7;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14->col = IVar9;
    pIVar14[1].pos.x = fVar23;
    pIVar14[1].pos.y = fVar2;
    DrawList->_VtxWritePtr[1].uv = IVar7;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[1].col = IVar9;
    pIVar14[2].pos.x = fVar24;
    pIVar14[2].pos.y = fVar2;
    pIVar14[2].uv = IVar7;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[2].col = IVar9;
    pIVar14[3].pos.x = fVar23;
    pIVar14[3].pos.y = fVar22;
    pIVar14[3].uv = IVar7;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[3].col = IVar9;
    DrawList->_VtxWritePtr = pIVar14 + 4;
    puVar15 = DrawList->_IdxWritePtr;
    *puVar15 = DrawList->_VtxCurrentIdx;
    puVar15[1] = DrawList->_VtxCurrentIdx + 1;
    puVar15[2] = DrawList->_VtxCurrentIdx + 2;
    puVar15[3] = DrawList->_VtxCurrentIdx;
    puVar15[4] = DrawList->_VtxCurrentIdx + 1;
    puVar15[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar15 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  IVar21.y = fVar22;
  this->P1 = IVar21;
  return bVar17;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddRectFilled(ImVec2(P1.x, P1.y + HalfWeight), ImVec2(P2.x, P1.y - HalfWeight), Col, DrawList, uv);
        AddRectFilled(ImVec2(P2.x - HalfWeight, P2.y), ImVec2(P2.x + HalfWeight, P1.y), Col, DrawList, uv);

        // AddLine(P1, P12, Weight, Col, DrawList, uv);
        // AddLine(P12, P2, Weight, Col, DrawList, uv);
        P1 = P2;
        return true;
    }